

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OclLib.cpp
# Opt level: O3

cl_int xmrig::OclLib::enqueueWriteBuffer
                 (cl_command_queue command_queue,cl_mem buffer,cl_bool blocking_write,size_t offset,
                 size_t size,void *ptr,cl_uint num_events_in_wait_list,cl_event *event_wait_list,
                 cl_event *event)

{
  cl_int ret;
  char *pcVar1;
  
  ret = (*pEnqueueWriteBuffer)
                  (command_queue,buffer,blocking_write,offset,size,ptr,num_events_in_wait_list,
                   event_wait_list,event);
  if (ret != 0) {
    pcVar1 = OclError::toString(ret);
    Log::print(ERR,
               "\x1b[45;1m\x1b[1;37m ocl \x1b[0m\x1b[0;31m error \x1b[0m\x1b[1;31m%s\x1b[0m\x1b[0;31m when calling \x1b[0m\x1b[1;31m%s\x1b[0m"
               ,pcVar1,"clEnqueueWriteBuffer");
  }
  return ret;
}

Assistant:

cl_int xmrig::OclLib::enqueueWriteBuffer(cl_command_queue command_queue, cl_mem buffer, cl_bool blocking_write, size_t offset, size_t size, const void *ptr, cl_uint num_events_in_wait_list, const cl_event *event_wait_list, cl_event *event) noexcept
{
    assert(pEnqueueWriteBuffer != nullptr);

    const cl_int ret = pEnqueueWriteBuffer(command_queue, buffer, blocking_write, offset, size, ptr, num_events_in_wait_list, event_wait_list, event);
    if (ret != CL_SUCCESS) {
        LOG_ERR(kErrorTemplate, OclError::toString(ret), kEnqueueWriteBuffer);
    }

    return ret;
}